

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

bool __thiscall duckdb::RowGroup::CheckZonemap(RowGroup *this,ScanFilterInfo *filters)

{
  TableFilter *filter;
  idx_t beg_row;
  FilterPropagateResult FVar1;
  const_reference pvVar2;
  ColumnData *this_00;
  size_type __n;
  bool bVar3;
  bool bVar4;
  
  ScanFilterInfo::CheckAllFilters(filters);
  bVar4 = (filters->filter_list).
          super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
          super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (filters->filter_list).
          super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>.
          super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (!bVar4) {
    __n = 0;
    do {
      pvVar2 = vector<duckdb::ScanFilter,_true>::operator[](&filters->filter_list,__n);
      filter = pvVar2->filter;
      if (pvVar2->table_column_index == 0xffffffffffffffff) {
        beg_row = (this->super_SegmentBase<duckdb::RowGroup>).start;
        FVar1 = CheckRowIdFilter(filter,beg_row,
                                 (this->super_SegmentBase<duckdb::RowGroup>).count.
                                 super___atomic_base<unsigned_long>._M_i + beg_row);
      }
      else {
        this_00 = GetColumn(this,pvVar2->table_column_index);
        FVar1 = ColumnData::CheckZonemap(this_00,filter);
      }
      if (FVar1 == FILTER_ALWAYS_FALSE) {
        return bVar4;
      }
      if ((filter->filter_type == OPTIONAL_FILTER) || (FVar1 == FILTER_ALWAYS_TRUE)) {
        ScanFilterInfo::SetFilterAlwaysTrue(filters,__n);
      }
      __n = __n + 1;
      bVar3 = __n < (ulong)(((long)(filters->filter_list).
                                   super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                                   .
                                   super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(filters->filter_list).
                                   super_vector<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                                   .
                                   super__Vector_base<duckdb::ScanFilter,_std::allocator<duckdb::ScanFilter>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333);
      bVar4 = !bVar3;
    } while (bVar3);
  }
  return bVar4;
}

Assistant:

bool RowGroup::CheckZonemap(ScanFilterInfo &filters) {
	auto &filter_list = filters.GetFilterList();
	// new row group - label all filters as up for grabs again
	filters.CheckAllFilters();
	for (idx_t i = 0; i < filter_list.size(); i++) {
		auto &entry = filter_list[i];
		auto &filter = entry.filter;
		auto base_column_index = entry.table_column_index;

		FilterPropagateResult prune_result;

		if (base_column_index == COLUMN_IDENTIFIER_ROW_ID) {
			prune_result = CheckRowIdFilter(filter, this->start, this->start + this->count);
		} else {
			prune_result = GetColumn(base_column_index).CheckZonemap(filter);
		}

		if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
			return false;
		}
		if (filter.filter_type == TableFilterType::OPTIONAL_FILTER) {
			// these are only for row group checking, set as always true so we don't check it
			filters.SetFilterAlwaysTrue(i);
		} else if (prune_result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
			// filter is always true - no need to check it
			// label the filter as always true so we don't need to check it anymore
			filters.SetFilterAlwaysTrue(i);
		}
	}
	return true;
}